

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O0

double __thiscall
imrt::IntensityILS::localSearch
          (IntensityILS *this,pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam,Plan *P)

{
  int iVar1;
  long in_RDI;
  double dVar2;
  byte in_stack_00000008;
  double eval;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double ratio;
  double delta_intensity;
  bool sign;
  int beamlet;
  Station *s;
  int in_stack_00000104;
  double in_stack_00000108;
  int in_stack_00000114;
  Station *in_stack_00000118;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff_00;
  Station *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  double local_30;
  double local_28;
  byte local_1d;
  
  local_1d = in_stack_00000008 & 1;
  iVar1 = rand();
  local_28 = (double)((int)((double)(iVar1 % (int)((*(double *)(in_RDI + 0x40) -
                                                   (double)*(int *)(in_RDI + 0x24)) + 1.0) +
                                    *(int *)(in_RDI + 0x24)) / (double)*(int *)(in_RDI + 0x24)) *
                     *(int *)(in_RDI + 0x24));
  *(double *)(in_RDI + 0x40) = *(double *)(in_RDI + 0x40) * *(double *)(in_RDI + 0x50);
  if (*(double *)(in_RDI + 0x40) < (double)*(int *)(in_RDI + 0x24)) {
    *(double *)(in_RDI + 0x40) = (double)*(int *)(in_RDI + 0x24);
  }
  if ((local_1d & 1) != 0) {
    local_28 = local_28 * -1.0;
  }
  if (*(double *)(in_RDI + 0x48) <= 0.5) {
    iVar1 = 0;
  }
  else {
    iVar1 = rand();
    iVar1 = iVar1 % (int)(*(double *)(in_RDI + 0x48) + 0.5);
  }
  local_30 = (double)iVar1;
  *(double *)(in_RDI + 0x48) = *(double *)(in_RDI + 0x48) * *(double *)(in_RDI + 0x58);
  diff_00 = &local_48;
  Station::increaseIntensity_repair_abi_cxx11_
            (in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000104);
  dVar2 = Plan::incremental_eval
                    ((Plan *)CONCAT44(iVar1,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
                     diff_00);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x173c23);
  return dVar2;
}

Assistant:

double IntensityILS::localSearch(pair<bool, pair<Station*, int>> target_beam, Plan& P){
		Station*s = target_beam.second.first; int beamlet=target_beam.second.second;
		bool sign=target_beam.first; //impact in F (+ or -)

		//double delta_intensity= rand()%3+1;

		double delta_intensity= rand()%int(maxdelta-step_intensity+1)+step_intensity; //random entre step_intensity y maxdelta
		delta_intensity = (int)  (delta_intensity/step_intensity) * step_intensity;

		maxdelta = maxdelta*alpha;
		if(maxdelta < step_intensity) maxdelta=step_intensity;

		if(sign) delta_intensity*=-1;

		double ratio= (maxratio>0.5)? rand()%int(maxratio + 0.5) : 0;
		maxratio = maxratio*beta;

		auto diff=s->increaseIntensity_repair(beamlet,delta_intensity,ratio);
		double eval=P.incremental_eval(*s,diff);
		//F.incremental_eval(*s,w,Zmin,Zmax, diff);

		return eval;
	}